

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskablock.c
# Opt level: O3

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block,stream *Input,int ForProfile)

{
  byte bVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  uint uVar7;
  long lVar8;
  ebml_context *peVar9;
  ebml_integer *Element;
  int64_t iVar10;
  ebml_string *Element_00;
  bool_t bVar11;
  long lVar12;
  undefined8 uVar13;
  ebml_master *peVar14;
  ebml_element *peVar15;
  ebml_binary *Element_01;
  byte *pbVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  char *pcVar21;
  uint uVar22;
  ulong uVar23;
  long lVar24;
  ebml_master *Track;
  ogg_buffer OggBuffer;
  vorbis_comment vc;
  vorbis_info vi;
  tchar_t CodecID [256];
  int local_228;
  ebml_master *local_220;
  long local_218;
  long local_210;
  long local_208;
  ogg_packet local_200;
  ogg_reference local_1d0;
  ogg_buffer local_1b0;
  vorbis_comment local_190;
  vorbis_info local_170;
  tchar_t local_138 [264];
  
  local_220 = (ebml_master *)0x0;
  if (Block == (matroska_block *)0x0) {
    __assert_fail("(const void*)(Block)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                  ,0x3b,
                  "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                 );
  }
  lVar8 = (**(code **)((long)(Block->Base).Base.Base.Base.VMT + 0x18))(Block,0x180,&local_220);
  peVar14 = local_220;
  if (lVar8 == 0) {
    if (local_220 == (ebml_master *)0x0) {
      __assert_fail("Track!=NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libmatroska2/matroskablock.c"
                    ,0x3e,
                    "err_t MATROSKA_BlockProcessFrameDurations(matroska_block *, struct stream *, int)"
                   );
    }
    peVar9 = MATROSKA_getContextTrackType();
    Element = (ebml_integer *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
    lVar8 = -3;
    if ((Element != (ebml_integer *)0x0) &&
       (iVar10 = EBML_IntegerValue(Element), peVar14 = local_220, iVar10 == 2)) {
      if (Block->FirstFrameLocation == 0) {
        lVar8 = -0x15;
      }
      else {
        peVar9 = MATROSKA_getContextCodecID();
        Element_00 = (ebml_string *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
        if (Element_00 != (ebml_string *)0x0) {
          EBML_StringGet(Element_00,local_138,0x100);
          sVar2 = (Block->Data)._Used;
          if ((sVar2 != 0) || (lVar8 = MATROSKA_BlockReadData(Block,Input,ForProfile), lVar8 == 0))
          {
            bVar11 = tcsisame_ascii(local_138,"A_MPEG/L3");
            if ((bVar11 == 0) &&
               ((bVar11 = tcsisame_ascii(local_138,"A_MPEG/L2"), bVar11 == 0 &&
                (bVar11 = tcsisame_ascii(local_138,"A_MPEG/L1"), bVar11 == 0)))) {
              bVar11 = tcsisame_ascii(local_138,"A_AC3");
              if (bVar11 == 0) {
                bVar11 = tcsisame_ascii(local_138,"A_EAC3");
                if (bVar11 == 0) {
                  bVar11 = tcsisame_ascii(local_138,"A_DTS");
                  if (bVar11 == 0) {
                    bVar11 = tcsisame_ascii(local_138,"A_AAC");
                    if ((bVar11 == 0) && (iVar20 = tcsncmp(local_138,"A_AAC/",6), iVar20 != 0)) {
                      bVar11 = tcsisame_ascii(local_138,"A_VORBIS");
                      peVar14 = local_220;
                      if (bVar11 == 0) {
                        lVar8 = 0;
                      }
                      else {
                        Block->IsKeyframe = 1;
                        peVar9 = MATROSKA_getContextCodecPrivate();
                        lVar8 = 0;
                        Element_01 = (ebml_binary *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
                        if (Element_01 != (ebml_binary *)0x0) {
                          vorbis_info_init(&local_170);
                          vorbis_comment_init(&local_190);
                          local_200.e_o_s = 0;
                          local_200.granulepos = 0;
                          local_200.bytes = 0;
                          local_200.b_o_s = 0;
                          pbVar16 = EBML_BinaryGetData(Element_01);
                          local_1b0.data = pbVar16;
                          local_1b0.size = EBML_ElementDataSize((ebml_element *)Element_01,1);
                          local_1d0.buffer = &local_1b0;
                          local_1b0.refcount = 1;
                          local_200.packet = &local_1d0;
                          local_1d0.begin = 0;
                          local_1d0.length = 0;
                          local_1d0.next = (ogg_reference *)0x0;
                          local_200.packetno = -1;
                          bVar1 = *pbVar16;
                          local_228 = bVar1 + 1;
                          lVar8 = 1;
                          while ((local_200.packetno < 3 && ((int)lVar8 <= (int)(uint)bVar1))) {
                            local_1d0.begin = (long)local_228;
                            local_1d0.length = 0;
                            lVar17 = (long)(int)lVar8;
                            do {
                              local_1d0.length = (ulong)local_1b0.data[lVar17] + local_1d0.length;
                              lVar8 = lVar17 + 1;
                              if (local_1b0.data[lVar17] != 0xff) break;
                              bVar5 = lVar17 < (long)(ulong)bVar1;
                              lVar17 = lVar8;
                            } while (bVar5);
                            local_228 = local_228 + (int)local_1d0.length;
                            if (local_1b0.size < local_228) {
                              return -3;
                            }
                            local_200.packetno = local_200.packetno + 1;
                            local_200.b_o_s = (long)(local_200.packetno == 0);
                            local_200.bytes = (local_200.packet)->length;
                            iVar20 = vorbis_synthesis_headerin(&local_170,&local_190,&local_200);
                            if (iVar20 < 0 && local_200.packetno == 0) {
                              return -3;
                            }
                          }
                          if (local_200.packetno < 3) {
                            local_1d0.begin = (long)local_228;
                            local_1d0.length = local_1b0.size - local_1d0.begin;
                            local_200.packetno = local_200.packetno + 1;
                            local_200.b_o_s = (long)(local_200.packetno == 0);
                            local_200.bytes = (local_200.packet)->length;
                            iVar20 = vorbis_synthesis_headerin(&local_170,&local_190,&local_200);
                            if ((iVar20 < 0) && (local_200.packetno == 0)) {
                              return -3;
                            }
                          }
                          lVar8 = 0;
                          ArrayResize(&Block->Durations,
                                      (Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                          if (3 < (Block->SizeList)._Used) {
                            pbVar16 = (byte *)(Block->Data)._Begin;
                            local_208 = local_170.rate << 0x20;
                            local_210 = (long)(int)local_170.rate;
                            iVar20 = *(int *)((long)local_170.codec_setup + 0x10);
                            uVar23 = 0;
                            local_218 = 0;
                            do {
                              lVar8 = local_218;
                              iVar20 = _ilog(iVar20 - 1);
                              uVar18 = (*pbVar16 & 0x7f) >> (7U - (char)iVar20 & 0x1f);
                              iVar20 = *(int *)((long)local_170.codec_setup + 0x10);
                              if (iVar20 < (int)uVar18) {
                                lVar8 = -3;
                              }
                              lVar17 = 0;
                              if (iVar20 < (int)uVar18) {
                                lVar17 = 0x7fffffffffffffff;
                              }
                              if (local_208 != 0 && (int)uVar18 <= iVar20) {
                                lVar17 = ((long)*(int *)((long)local_170.codec_setup +
                                                        (long)**(int **)((long)local_170.codec_setup
                                                                        + (ulong)uVar18 * 8 + 0x28)
                                                        * 8) * 1000000000) / local_210;
                                lVar8 = local_218;
                              }
                              *(long *)((Block->Durations)._Begin + uVar23 * 8) = lVar17;
                              pbVar16 = pbVar16 + *(int *)((Block->SizeList)._Begin + uVar23 * 4);
                              uVar23 = uVar23 + 1;
                              local_218 = lVar8;
                            } while (uVar23 < (Block->SizeList)._Used >> 2);
                          }
                          vorbis_comment_clear(&local_190);
                          vorbis_info_clear(&local_170);
                        }
                      }
                    }
                    else {
                      peVar14 = local_220;
                      Block->IsKeyframe = 1;
                      peVar9 = MATROSKA_getContextAudio();
                      lVar8 = 0;
                      peVar14 = (ebml_master *)EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
                      if (peVar14 != (ebml_master *)0x0) {
                        peVar9 = MATROSKA_getContextSamplingFrequency();
                        lVar8 = 0;
                        peVar15 = EBML_MasterFindFirstElt(peVar14,peVar9,0,0,0);
                        if (peVar15 != (ebml_element *)0x0) {
                          lVar8 = 0;
                          ArrayResize(&Block->Durations,
                                      (Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                          if (3 < (Block->SizeList)._Used) {
                            iVar20 = (int)*(double *)&peVar15[1].Base.Base;
                            pcVar3 = (Block->Durations)._Begin;
                            lVar8 = 0;
                            uVar23 = 0;
                            do {
                              if (iVar20 == 0) {
                                uVar13 = 0;
                              }
                              else {
                                uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xee6b280000)) /
                                                SEXT816((long)iVar20),0);
                              }
                              *(undefined8 *)(pcVar3 + uVar23 * 8) = uVar13;
                              uVar23 = uVar23 + 1;
                            } while (uVar23 < (Block->SizeList)._Used >> 2);
                          }
                        }
                      }
                    }
                  }
                  else {
                    Block->IsKeyframe = 1;
                    lVar8 = 0;
                    ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0
                               );
                    if (3 < (Block->SizeList)._Used) {
                      pcVar3 = (Block->SizeList)._Begin;
                      pcVar21 = (Block->Data)._Begin;
                      pcVar4 = (Block->Durations)._Begin;
                      uVar23 = 0;
                      lVar17 = 0;
                      do {
                        uVar18 = (byte)pcVar21[8] >> 2 & 0xf;
                        uVar13 = 0x7fffffffffffffff;
                        lVar8 = -3;
                        if ((0xc631U >> uVar18 & 1) == 0) {
                          auVar6._8_8_ = 0;
                          auVar6._0_8_ = (ulong)(byte)((byte)pcVar21[5] >> 2 | pcVar21[4] << 7) *
                                         32000000000 + 32000000000;
                          uVar13 = SUB168(auVar6 / SEXT816((long)A_DTS_freq[uVar18]),0);
                          lVar8 = lVar17;
                        }
                        *(undefined8 *)(pcVar4 + uVar23 * 8) = uVar13;
                        pcVar21 = pcVar21 + *(int *)(pcVar3 + uVar23 * 4);
                        uVar23 = uVar23 + 1;
                        lVar17 = lVar8;
                      } while (uVar23 < (Block->SizeList)._Used >> 2);
                    }
                  }
                }
                else {
                  Block->IsKeyframe = 1;
                  lVar8 = 0;
                  ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                  if (3 < (Block->SizeList)._Used) {
                    pcVar3 = (Block->SizeList)._Begin;
                    pcVar21 = (Block->Data)._Begin;
                    pcVar4 = (Block->Durations)._Begin;
                    uVar23 = 0;
                    lVar17 = 0;
                    do {
                      uVar22 = (uint)((byte)pcVar21[4] >> 6);
                      uVar18 = (byte)pcVar21[4] >> 4 & 3;
                      lVar24 = 0x7fffffffffffffff;
                      lVar8 = -3;
                      if (uVar18 != 3 || uVar22 != 3) {
                        lVar24 = 0x165a0bc0000;
                        uVar7 = uVar18 + 3;
                        if (uVar22 != 3) {
                          uVar7 = uVar22;
                        }
                        if (uVar22 != 3) {
                          lVar24 = (long)A_EAC3_samples[uVar18] * 1000000000;
                        }
                        lVar24 = lVar24 / (long)A_EAC3_freq[uVar7];
                        lVar8 = lVar17;
                      }
                      *(long *)(pcVar4 + uVar23 * 8) = lVar24;
                      pcVar21 = pcVar21 + *(int *)(pcVar3 + uVar23 * 4);
                      uVar23 = uVar23 + 1;
                      lVar17 = lVar8;
                    } while (uVar23 < (Block->SizeList)._Used >> 2);
                  }
                }
              }
              else {
                Block->IsKeyframe = 1;
                lVar8 = 0;
                ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
                if (3 < (Block->SizeList)._Used) {
                  pcVar3 = (Block->SizeList)._Begin;
                  pcVar21 = (Block->Data)._Begin;
                  pcVar4 = (Block->Durations)._Begin;
                  uVar23 = 0;
                  lVar17 = 0;
                  do {
                    uVar13 = 0x7fffffffffffffff;
                    lVar8 = -3;
                    if (0xe7 < (byte)(pcVar21[5] + 0xa8U)) {
                      lVar24 = (long)*(int *)((long)A_AC3_freq[0] +
                                             (ulong)((byte)pcVar21[4] >> 6) * 4 +
                                             (ulong)((byte)pcVar21[5] & 0x18) * 2);
                      lVar8 = lVar17;
                      if (lVar24 == 0) {
                        uVar13 = 0;
                      }
                      else {
                        uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x165a0bc0000)) /
                                        SEXT816(lVar24),0);
                      }
                    }
                    *(undefined8 *)(pcVar4 + uVar23 * 8) = uVar13;
                    pcVar21 = pcVar21 + *(int *)(pcVar3 + uVar23 * 4);
                    uVar23 = uVar23 + 1;
                    lVar17 = lVar8;
                  } while (uVar23 < (Block->SizeList)._Used >> 2);
                }
              }
            }
            else {
              Block->IsKeyframe = 1;
              lVar8 = 0;
              ArrayResize(&Block->Durations,(Block->SizeList)._Used * 2 & 0xfffffffffffffff8,0);
              if (3 < (Block->SizeList)._Used) {
                pcVar3 = (Block->SizeList)._Begin;
                pcVar21 = (Block->Data)._Begin;
                pcVar4 = (Block->Durations)._Begin;
                uVar23 = 0;
                lVar17 = 0;
                do {
                  uVar19 = (ulong)((byte)pcVar21[1] >> 1 & 0xc);
                  lVar24 = (long)*(int *)((long)A_MPEG_freq[0] +
                                         uVar19 + (ulong)((byte)pcVar21[2] & 0xc) * 4);
                  lVar8 = -3;
                  if (lVar24 == 0) {
                    lVar12 = 0x7fffffffffffffff;
                  }
                  else {
                    iVar20 = *(int *)((long)A_MPEG_samples[0] +
                                     uVar19 + (ulong)((byte)pcVar21[1] & 6) * 8);
                    lVar12 = 0x7fffffffffffffff;
                    if (iVar20 != 0) {
                      lVar12 = ((long)iVar20 * 1000000000) / lVar24;
                      lVar8 = lVar17;
                    }
                  }
                  *(long *)(pcVar4 + uVar23 * 8) = lVar12;
                  pcVar21 = pcVar21 + *(int *)(pcVar3 + uVar23 * 4);
                  uVar23 = uVar23 + 1;
                  lVar17 = lVar8;
                } while (uVar23 < (Block->SizeList)._Used >> 2);
              }
            }
            if (sVar2 == 0) {
              ArrayClear(&Block->Data);
              (Block->Base).Base.bValueIsSet = '\0';
            }
          }
        }
      }
    }
  }
  return lVar8;
}

Assistant:

err_t MATROSKA_BlockProcessFrameDurations(matroska_block *Block, struct stream *Input, int ForProfile)
{
    ebml_master *Track=NULL;
    ebml_element *Elt;
    tchar_t CodecID[MAXPATH];
    err_t Err;
    bool_t ReadData;
    uint8_t *Cursor;
    size_t Frame;
    int Version, Layer, SampleRate, Samples, fscod, fscod2;

    Err = Node_GET(Block,MATROSKA_BLOCK_READ_TRACK,&Track);
    if (Err==ERR_NONE)
    {
        assert(Track!=NULL);
        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextTrackType());
        if (!Elt || EBML_IntegerValue((ebml_integer*)Elt)!=MATROSKA_TRACK_TYPE_AUDIO) // other track types not supported for now
            Err = ERR_INVALID_DATA;
        else
        {
            if (Block->FirstFrameLocation==0)
                Err = ERR_READ;
            else
            {
                Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecID());
                if (!Elt) // missing codec ID
                    Err = ERR_INVALID_DATA;
                else
                {
                    EBML_StringGet((ebml_string*)Elt,CodecID,TSIZEOF(CodecID));
                    ReadData = 0;
                    if (!ARRAYCOUNT(Block->Data,uint8_t))
                    {
                        Err = MATROSKA_BlockReadData(Block,Input,ForProfile);
                        if (Err!=ERR_NONE)
                            goto exit;
                        ReadData = 1;
                    }

                    if (tcsisame_ascii(CodecID,T("A_MPEG/L3")) || tcsisame_ascii(CodecID,T("A_MPEG/L2")) || tcsisame_ascii(CodecID,T("A_MPEG/L1")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Version = (Cursor[1] >> 3) & 3;
                            Layer = (Cursor[1] >> 1) & 3;
                            SampleRate = (Cursor[2] >> 2) & 3;

                            Samples = A_MPEG_samples[Layer][Version];
                            SampleRate = A_MPEG_freq[SampleRate][Version];
                            if (SampleRate!=0 && Samples!=0)
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            else
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }

                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[5] >> 3;
                            SampleRate = Cursor[4] >> 6;
                            if (fscod > 10 || fscod < 8)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_AC3_freq[fscod-8][SampleRate];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,1536,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_EAC3")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            fscod =  Cursor[4] >> 6;
                            fscod2 = (Cursor[4] >> 4) & 0x03;
                            if ((0x03 == fscod) && (0x03 == fscod2))
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                            {
                                SampleRate = A_EAC3_freq[0x03 == fscod ? 3 + fscod2 : fscod];
                                Samples = (0x03 == fscod) ? 1536 : A_EAC3_samples[fscod2];
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_DTS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                        Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                        for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                        {
                            Samples = (((Cursor[4] & 1) << 7) + (Cursor[5] >> 2) + 1) * 32;
                            // TODO: handle the frame termination
                            SampleRate = A_DTS_freq[(Cursor[8] >> 2) & 0x0F];
                            if (Samples==0 || SampleRate==0)
                            {
                                Err = ERR_INVALID_DATA;
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                //goto exit;
                            }
                            else
                                ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                        }
                    }
                    else if (tcsisame_ascii(CodecID,T("A_AAC")) || tcsncmp(CodecID,T("A_AAC/"),6)==0)
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextAudio());
                        if (Elt)
                        {
                            Elt = EBML_MasterFindChild((ebml_master*)Elt,MATROSKA_getContextSamplingFrequency());
                            if (Elt)
                            {
                                ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                                Samples = 1024;
                                SampleRate = (int)((ebml_float*)Elt)->Value;
                                for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                            }
                        }
                    }
#if defined(CONFIG_CODEC_HELPER)
                    else if (tcsisame_ascii(CodecID,T("A_VORBIS")))
                    {
                        Block->IsKeyframe = 1; // safety
                        Elt = EBML_MasterFindChild(Track,MATROSKA_getContextCodecPrivate());
                        if (Elt)
                        {
                            vorbis_info vi;
                            vorbis_comment vc;
                            ogg_packet OggPacket;
                        	ogg_reference OggRef;
                        	ogg_buffer OggBuffer;
                            int n,i,j;
                            codec_setup_info *ci;

		                    vorbis_info_init(&vi);
		                    vorbis_comment_init(&vc);
                            memset(&OggPacket,0,sizeof(ogg_packet));

		                    OggBuffer.data = (uint8_t*)EBML_BinaryGetData((ebml_binary*)Elt);
		                    OggBuffer.size = (long)EBML_ElementDataSize(Elt, 1);
		                    OggBuffer.refcount = 1;

                            memset(&OggRef,0,sizeof(OggRef));
		                    OggRef.buffer = &OggBuffer;
		                    OggRef.next = NULL;

		                    OggPacket.packet = &OggRef;
		                    OggPacket.packetno = -1;

		                    n = OggBuffer.data[0];
		                    i = 1+n;
		                    j = 1;

		                    while (OggPacket.packetno < 3 && n>=j)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = 0;
			                    do
			                    {
				                    OggRef.length += OggBuffer.data[j];
			                    }
			                    while (OggBuffer.data[j++] == 255 && n>=j);
			                    i += OggRef.length;

			                    if (i > OggBuffer.size)
				                    return ERR_INVALID_DATA;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;
			                    if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
		                    }

		                    if (OggPacket.packetno < 3)
		                    {
			                    OggRef.begin = i;
			                    OggRef.length = OggBuffer.size - i;

	                            ++OggPacket.packetno;
	                            OggPacket.b_o_s = OggPacket.packetno == 0;
	                            OggPacket.bytes = OggPacket.packet->length;

                                if (!(vorbis_synthesis_headerin(&vi,&vc,&OggPacket) >= 0) && OggPacket.packetno==0)
				                    return ERR_INVALID_DATA;
                            }

                            SampleRate = vi.rate;
                            ArrayResize(&Block->Durations,sizeof(mkv_timestamp_t)*ARRAYCOUNT(Block->SizeList,int32_t),0);
                            Cursor = ARRAYBEGIN(Block->Data,uint8_t);
                            ci = vi.codec_setup;
                            for (Frame=0;Frame<ARRAYCOUNT(Block->SizeList,int32_t);++Frame)
                            {
                                fscod = _ilog(ci->modes-1);
                                fscod = (Cursor[0] & 0x7F) >> (7-fscod);
                                if (fscod > ci->modes)
                                {
                                    Err = ERR_INVALID_DATA;
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = INVALID_TIMESTAMP_T;
                                    //goto exit;
                                }
                                else
                                {
                                    Samples = ci->blocksizes[ci->mode_param[fscod]->blockflag];
                                    ARRAYBEGIN(Block->Durations,mkv_timestamp_t)[Frame] = Scale64(1000000000,Samples,SampleRate);
                                }
                                Cursor += ARRAYBEGIN(Block->SizeList,int32_t)[Frame];
                            }
                            vorbis_comment_clear(&vc);
                            vorbis_info_clear(&vi);
                        }
                    }
#endif

                    if (ReadData)
                    {
                        ArrayClear(&Block->Data);
                        Block->Base.Base.bValueIsSet = 0;
                    }
                }
            }
        }
    }
exit:
    return Err;
}